

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZEllipse3D>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZEllipse3D> *this,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZEllipse3D> *cp)

{
  TPZRegisterClassId *pTVar1;
  TPZRegisterClassId *pTVar2;
  long in_RDX;
  TPZRegisterClassId *in_RDI;
  int n;
  int i;
  TPZGeoEl *in_stack_ffffffffffffff68;
  TPZGeoMesh *in_stack_ffffffffffffff70;
  void **in_stack_ffffffffffffff78;
  TPZGeoEl *in_stack_ffffffffffffff80;
  TPZGeoMesh *in_stack_ffffffffffffff90;
  TPZEllipse3D *in_stack_ffffffffffffff98;
  TPZEllipse3D *in_stack_ffffffffffffffa0;
  int local_38;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZEllipse3D>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02460c60);
  TPZGeoEl::TPZGeoEl(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                     in_stack_ffffffffffffff68);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02460948;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02460948;
  pzgeom::TPZEllipse3D::TPZEllipse3D
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  pTVar1 = in_RDI + 400;
  pTVar2 = in_RDI + 0x1d8;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex((TPZGeoElSideIndex *)in_stack_ffffffffffffff70);
    pTVar1 = pTVar1 + 0x18;
  } while (pTVar1 != pTVar2);
  for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(in_RDI + (long)local_38 * 0x18 + 400),
               (TPZGeoElSideIndex *)(in_RDX + 400 + (long)local_38 * 0x18));
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZGeoMesh &DestMesh, const TPZGeoElRefLess &cp):
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp), fGeo(cp.fGeo,DestMesh) {
	int i;
	const int n = TGeo::NSides;
	for(i = 0; i < n; i++){
		this->fNeighbours[i] = cp.fNeighbours[i];
	}
}